

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reusable_node.h
# Opt level: O2

_Bool reusable_node_descend(ReusableNode *self)

{
  uint32_t uVar1;
  StackEntry *pSVar2;
  SubtreeHeapData *pSVar3;
  _Bool _Var4;
  uint uVar5;
  
  uVar1 = (self->stack).size;
  if (uVar1 != 0) {
    uVar5 = uVar1 - 1;
    pSVar2 = (self->stack).contents;
    pSVar3 = pSVar2[uVar5].tree.ptr;
    if ((((ulong)pSVar3 & 1) == 0) && (pSVar3->child_count != 0)) {
      uVar1 = pSVar2[uVar5].byte_offset;
      array__grow((VoidArray *)self,0x10);
      pSVar2 = (self->stack).contents;
      uVar5 = (self->stack).size;
      (self->stack).size = uVar5 + 1;
      pSVar2[uVar5].tree = *(pSVar3->field_17).field_0.children;
      pSVar2[uVar5].child_index = 0;
      pSVar2[uVar5].byte_offset = uVar1;
      _Var4 = true;
    }
    else {
      _Var4 = false;
    }
    return _Var4;
  }
  __assert_fail("(uint32_t)(&self->stack)->size - 1 < (&self->stack)->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/reusable_node.h"
                ,0x48,"_Bool reusable_node_descend(ReusableNode *)");
}

Assistant:

static inline bool reusable_node_descend(ReusableNode *self) {
  StackEntry last_entry = *array_back(&self->stack);
  if (ts_subtree_child_count(last_entry.tree) > 0) {
    array_push(&self->stack, ((StackEntry) {
      .tree = last_entry.tree.ptr->children[0],
      .child_index = 0,
      .byte_offset = last_entry.byte_offset,
    }));
    return true;
  } else {
    return false;
  }
}